

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataType.cpp
# Opt level: O3

string * __thiscall
CoreML::FeatureType::toString_abi_cxx11_(string *__return_storage_ptr__,FeatureType *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  element_type *peVar3;
  long lVar4;
  DictionaryFeatureType *pDVar5;
  SequenceFeatureType *pSVar6;
  SizeRange *pSVar7;
  ImageFeatureType *params;
  ArrayFeatureType *params_00;
  long *plVar8;
  char useArrayFormat;
  size_type *psVar9;
  TypeCase tag;
  KeyTypeCase tag_00;
  TypeCase seqType;
  ImageFeatureType_ColorSpace colorspace;
  ArrayFeatureType_ArrayDataType dataType;
  undefined1 in_R8B;
  vector<long,_std::allocator<long>_> size;
  stringstream ss;
  string local_1e8;
  vector<long,_std::allocator<long>_> local_1c8;
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  uVar2 = ((this->m_type).
           super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          )->_oneof_case_[0];
  featureTypeToString_abi_cxx11_(&local_1e8,(CoreML *)(ulong)uVar2,tag);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a0,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
  paVar1 = &local_1e8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,
                    CONCAT17(local_1e8.field_2._M_local_buf[7],
                             CONCAT16(local_1e8.field_2._M_local_buf[6],
                                      CONCAT24(local_1e8.field_2._M_allocated_capacity._4_2_,
                                               local_1e8.field_2._M_allocated_capacity._0_4_))) + 1)
    ;
  }
  if (3 < uVar2 - 4) goto switchD_002587c5_default;
  useArrayFormat = (char)(&switchD_002587c5::switchdataD_0030f938)[uVar2 - 4] + '8';
  switch(uVar2) {
  case 4:
    peVar3 = (this->m_type).
             super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (peVar3->_oneof_case_[0] == 4) {
      params = (peVar3->Type_).imagetype_;
    }
    else {
      params = Specification::ImageFeatureType::default_instance();
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0," (",2);
    colorSpaceToString_abi_cxx11_(&local_1e8,(CoreML *)(ulong)(uint)params->colorspace_,colorspace);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a0,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1e8._M_dataplus._M_p,
                      CONCAT17(local_1e8.field_2._M_local_buf[7],
                               CONCAT16(local_1e8.field_2._M_local_buf[6],
                                        CONCAT24(local_1e8.field_2._M_allocated_capacity._4_2_,
                                                 local_1e8.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    defaultSizeOf(&local_1c8,params);
    if (local_1c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        local_1c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a0," ",1);
      dimensionsToString_abi_cxx11_
                (&local_1e8,(CoreML *)&local_1c8,(vector<long,_std::allocator<long>_> *)0x0,
                 (bool)useArrayFormat);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a0,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1e8._M_dataplus._M_p,
                        CONCAT17(local_1e8.field_2._M_local_buf[7],
                                 CONCAT16(local_1e8.field_2._M_local_buf[6],
                                          CONCAT24(local_1e8.field_2._M_allocated_capacity._4_2_,
                                                   local_1e8.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0,")",1);
    break;
  case 5:
    peVar3 = (this->m_type).
             super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (peVar3->_oneof_case_[0] == 5) {
      params_00 = (peVar3->Type_).multiarraytype_;
    }
    else {
      params_00 = Specification::ArrayFeatureType::default_instance();
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0," (",2);
    dataTypeToString_abi_cxx11_(&local_1e8,(CoreML *)(ulong)(uint)params_00->datatype_,dataType);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a0,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1e8._M_dataplus._M_p,
                      CONCAT17(local_1e8.field_2._M_local_buf[7],
                               CONCAT16(local_1e8.field_2._M_local_buf[6],
                                        CONCAT24(local_1e8.field_2._M_allocated_capacity._4_2_,
                                                 local_1e8.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    defaultShapeOf(&local_1c8,params_00);
    if (local_1c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        local_1c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a0," ",1);
      dimensionsToString_abi_cxx11_
                (&local_1e8,(CoreML *)&local_1c8,(vector<long,_std::allocator<long>_> *)0x0,
                 (bool)useArrayFormat);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a0,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1e8._M_dataplus._M_p,
                        CONCAT17(local_1e8.field_2._M_local_buf[7],
                                 CONCAT16(local_1e8.field_2._M_local_buf[6],
                                          CONCAT24(local_1e8.field_2._M_allocated_capacity._4_2_,
                                                   local_1e8.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0,")",1);
    break;
  case 6:
    peVar3 = (this->m_type).
             super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (peVar3->_oneof_case_[0] == 6) {
      pDVar5 = (peVar3->Type_).dictionarytype_;
    }
    else {
      pDVar5 = Specification::DictionaryFeatureType::default_instance();
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0," (",2);
    keyTypeToString_abi_cxx11_(&local_1e8,(CoreML *)(ulong)pDVar5->_oneof_case_[0],tag_00);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a0,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1e8._M_dataplus._M_p,
                      CONCAT17(local_1e8.field_2._M_local_buf[7],
                               CONCAT16(local_1e8.field_2._M_local_buf[6],
                                        CONCAT24(local_1e8.field_2._M_allocated_capacity._4_2_,
                                                 local_1e8.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0,anon_var_dwarf_4090bd,5);
    local_1e8.field_2._M_allocated_capacity._0_4_ = 0x62756f44;
    local_1e8.field_2._M_allocated_capacity._4_2_ = 0x656c;
    local_1e8._M_string_length = 6;
    local_1e8.field_2._M_local_buf[6] = '\0';
    local_1e8._M_dataplus._M_p = (pointer)paVar1;
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0,paVar1->_M_local_buf,6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1e8._M_dataplus._M_p,
                      CONCAT17(local_1e8.field_2._M_local_buf[7],
                               CONCAT16(local_1e8.field_2._M_local_buf[6],
                                        CONCAT24(local_1e8.field_2._M_allocated_capacity._4_2_,
                                                 local_1e8.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0,")",1);
    goto switchD_002587c5_default;
  case 7:
    peVar3 = (this->m_type).
             super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (peVar3->_oneof_case_[0] == 7) {
      pSVar6 = (peVar3->Type_).sequencetype_;
    }
    else {
      pSVar6 = Specification::SequenceFeatureType::default_instance();
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0," (",2);
    sequenceTypeToString_abi_cxx11_(&local_1e8,(CoreML *)(ulong)pSVar6->_oneof_case_[0],seqType);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a0,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1e8._M_dataplus._M_p,
                      CONCAT17(local_1e8.field_2._M_local_buf[7],
                               CONCAT16(local_1e8.field_2._M_local_buf[6],
                                        CONCAT24(local_1e8.field_2._M_allocated_capacity._4_2_,
                                                 local_1e8.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0," ",1);
    pSVar7 = pSVar6->sizerange_;
    if (pSVar7 == (SizeRange *)0x0) {
      pSVar7 = (SizeRange *)&Specification::_SizeRange_default_instance_;
    }
    rangeToString_abi_cxx11_
              (&local_1e8,(CoreML *)pSVar7->lowerbound_,pSVar7->upperbound_,0,(bool)in_R8B);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a0,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1e8._M_dataplus._M_p,
                      CONCAT17(local_1e8.field_2._M_local_buf[7],
                               CONCAT16(local_1e8.field_2._M_local_buf[6],
                                        CONCAT24(local_1e8.field_2._M_allocated_capacity._4_2_,
                                                 local_1e8.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0,")",1);
    goto switchD_002587c5_default;
  }
  if (local_1c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
switchD_002587c5_default:
  std::__cxx11::stringbuf::str();
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_1e8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar9 = (size_type *)(plVar8 + 2);
  if ((size_type *)*plVar8 == psVar9) {
    lVar4 = plVar8[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar8;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
  }
  __return_storage_ptr__->_M_string_length = plVar8[1];
  *plVar8 = (long)psVar9;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,
                    CONCAT17(local_1e8.field_2._M_local_buf[7],
                             CONCAT16(local_1e8.field_2._M_local_buf[6],
                                      CONCAT24(local_1e8.field_2._M_allocated_capacity._4_2_,
                                               local_1e8.field_2._M_allocated_capacity._0_4_))) + 1)
    ;
  }
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string FeatureType::toString() const {
        std::stringstream ss;
        Specification::FeatureType::TypeCase tag = m_type->Type_case();

        ss << featureTypeToString(tag);

        switch (tag) {
            case Specification::FeatureType::kMultiArrayType:
            {
                const Specification::ArrayFeatureType& params = m_type->multiarraytype();
                ss << " (" << dataTypeToString(params.datatype());
                std::vector<int64_t> shape = defaultShapeOf(params);
                if (shape.size() > 0) {
                    ss << " ";
                    ss << dimensionsToString(shape);
                }
                ss << ")";
                break;
            }
            case Specification::FeatureType::kDictionaryType:
            {
                const Specification::DictionaryFeatureType& params = m_type->dictionarytype();
                ss << " (";
                ss << keyTypeToString(params.KeyType_case());
                ss << " → ";
                ss << featureTypeToString(Specification::FeatureType::kDoubleType); // assume double value
                ss << ")";
                break;
            }
            case Specification::FeatureType::kImageType:
            {
                const Specification::ImageFeatureType& params = m_type->imagetype();
                ss << " (";
                ss << colorSpaceToString(params.colorspace());
                std::vector<int64_t> size = defaultSizeOf(params);
                if (size.size() > 0) {
                    ss << " ";
                    ss << dimensionsToString(size);
                }
                ss << ")";
                break;
            }
            case Specification::FeatureType::kSequenceType:
            {
                const Specification::SequenceFeatureType& params = m_type->sequencetype();
                ss << " (";
                ss << sequenceTypeToString(params.Type_case());
                ss << " " << rangeToString((int64_t)params.sizerange().lowerbound(),params.sizerange().upperbound());
                ss << ")";
                break;
            }
            default:
                break;
        }
        return ss.str() + (m_type->isoptional() ? "?" : "");
    }